

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

int xmlPythonFileRead(void *context,char *buffer,int len)

{
  int iVar1;
  char *tmp;
  Py_ssize_t size;
  char *data;
  PyObject *pPStack_38;
  int lenread;
  PyObject *ret;
  PyObject *file;
  char *pcStack_20;
  int len_local;
  char *buffer_local;
  void *context_local;
  
  data._4_4_ = 0xffffffff;
  if (context == (void *)0x0) {
    context_local._4_4_ = -1;
  }
  else {
    ret = (PyObject *)context;
    file._4_4_ = len;
    pcStack_20 = buffer;
    buffer_local = (char *)context;
    pPStack_38 = (PyObject *)_PyObject_CallMethod_SizeT(context,"io_read","(i)",len);
    if (pPStack_38 == (PyObject *)0x0) {
      printf("xmlPythonFileRead: result is NULL\n");
      context_local._4_4_ = -1;
    }
    else {
      iVar1 = PyType_HasFeature(pPStack_38->ob_type,0x8000000);
      if (iVar1 == 0) {
        iVar1 = PyType_HasFeature(pPStack_38->ob_type,0x10000000);
        if (iVar1 == 0) {
          printf("xmlPythonFileRead: result is not a String\n");
          _Py_DECREF(pPStack_38);
          return -1;
        }
        size = PyUnicode_AsUTF8AndSize(pPStack_38,&tmp);
        data._4_4_ = (int)tmp;
      }
      else {
        data._4_4_ = PyBytes_Size(pPStack_38);
        size = PyBytes_AsString(pPStack_38);
      }
      if (file._4_4_ < data._4_4_) {
        memcpy(pcStack_20,(void *)size,(long)file._4_4_);
      }
      else {
        memcpy(pcStack_20,(void *)size,(long)data._4_4_);
      }
      _Py_DECREF(pPStack_38);
      context_local._4_4_ = data._4_4_;
    }
  }
  return context_local._4_4_;
}

Assistant:

static int
xmlPythonFileRead (void * context, char * buffer, int len) {
    PyObject *file;
    PyObject *ret;
    int lenread = -1;
    char *data;

    file = (PyObject *) context;
    if (file == NULL) return(-1);
    ret = PyObject_CallMethod(file, (char *) "io_read", (char *) "(i)", len);
    if (ret == NULL) {
	printf("xmlPythonFileRead: result is NULL\n");
	return(-1);
    } else if (PyBytes_Check(ret)) {
	lenread = PyBytes_Size(ret);
	data = PyBytes_AsString(ret);
#ifdef PyUnicode_Check
    } else if (PyUnicode_Check (ret)) {
#if PY_VERSION_HEX >= 0x03030000
        Py_ssize_t size;
	const char *tmp;

	/* tmp doesn't need to be deallocated */
        tmp = PyUnicode_AsUTF8AndSize(ret, &size);

	lenread = (int) size;
	data = (char *) tmp;
#else
        PyObject *b;
	b = PyUnicode_AsUTF8String(ret);
	if (b == NULL) {
	    printf("xmlPythonFileRead: failed to convert to UTF-8\n");
	    return(-1);
	}
	lenread = PyBytes_Size(b);
	data = PyBytes_AsString(b);
	Py_DECREF(b);
#endif
#endif
    } else {
	printf("xmlPythonFileRead: result is not a String\n");
	Py_DECREF(ret);
	return(-1);
    }
    if (lenread > len)
	memcpy(buffer, data, len);
    else
	memcpy(buffer, data, lenread);
    Py_DECREF(ret);
    return(lenread);
}